

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasePort.cpp
# Opt level: O3

bool __thiscall BasePort::ReScanNodes(BasePort *this,string *caller)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  
  uVar1 = this->FwBusGeneration;
  (*this->_vptr_BasePort[0x13])(this,(ulong)this->newFwBusGeneration);
  iVar2 = (*this->_vptr_BasePort[3])(this);
  if (SUB41(iVar2,0) == false) {
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (this->outStr,(caller->_M_dataplus)._M_p,caller->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,": failed to rescan nodes",0x18);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
    std::ostream::put((char)poVar3);
    std::ostream::flush();
    (*this->_vptr_BasePort[0x13])(this,(ulong)uVar1);
  }
  return SUB41(iVar2,0);
}

Assistant:

bool BasePort::ReScanNodes(const std::string &caller)
{
    unsigned int oldFwBusGeneration = FwBusGeneration;
    UpdateBusGeneration(newFwBusGeneration);
    bool ret = ScanNodes();
    if (!ret) {
        outStr << caller << ": failed to rescan nodes" << std::endl;
        UpdateBusGeneration(oldFwBusGeneration);
    }
    return ret;
}